

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extent.c
# Opt level: O0

extent_t * extent_heap_first(extent_heap_t *ph)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  int iVar6;
  long *in_RDI;
  extent_t *phn0child_7;
  extent_t *phn0child_6;
  extent_t *phn0child_5;
  extent_t *phn0child_4;
  extent_t *phn0child_3;
  extent_t *phn0child_2;
  extent_t *phn0child_1;
  extent_t *phn0child;
  extent_t *phnrest;
  extent_t *phn1;
  extent_t *phn0;
  extent_t *tail;
  extent_t *head;
  extent_t *phn;
  extent_t *in_stack_ffffffffffffff80;
  extent_t *in_stack_ffffffffffffff88;
  long local_38;
  long local_30;
  long local_28;
  extent_t *local_8;
  
  if (*in_RDI == 0) {
    local_8 = (extent_t *)0x0;
  }
  else {
    lVar1 = *(long *)(*in_RDI + 0x30);
    if (lVar1 != 0) {
      *(undefined8 *)(*in_RDI + 0x28) = 0;
      *(undefined8 *)(*in_RDI + 0x30) = 0;
      *(undefined8 *)(lVar1 + 0x28) = 0;
      lVar2 = *(long *)(lVar1 + 0x30);
      local_30 = lVar1;
      if (lVar2 != 0) {
        lVar3 = *(long *)(lVar2 + 0x30);
        if (lVar3 != 0) {
          *(undefined8 *)(lVar3 + 0x28) = 0;
        }
        *(undefined8 *)(lVar1 + 0x28) = 0;
        *(undefined8 *)(lVar1 + 0x30) = 0;
        *(undefined8 *)(lVar2 + 0x28) = 0;
        *(undefined8 *)(lVar2 + 0x30) = 0;
        local_30 = lVar2;
        if ((lVar1 != 0) && (local_30 = lVar1, lVar2 != 0)) {
          iVar6 = extent_snad_comp(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
          if (iVar6 < 0) {
            *(long *)(lVar2 + 0x28) = lVar1;
            lVar5 = *(long *)(lVar1 + 0x38);
            *(long *)(lVar2 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar2;
            }
            *(long *)(lVar1 + 0x38) = lVar2;
          }
          else {
            *(long *)(lVar1 + 0x28) = lVar2;
            lVar5 = *(long *)(lVar2 + 0x38);
            *(long *)(lVar1 + 0x30) = lVar5;
            if (lVar5 != 0) {
              *(long *)(lVar5 + 0x28) = lVar1;
            }
            *(long *)(lVar2 + 0x38) = lVar1;
            local_30 = lVar2;
          }
        }
        lVar1 = local_30;
        local_28 = local_30;
        local_30 = lVar3;
        while (local_30 != 0) {
          lVar2 = *(long *)(local_30 + 0x30);
          if (lVar2 == 0) {
            *(long *)(local_28 + 0x30) = local_30;
            local_28 = local_30;
            local_30 = 0;
          }
          else {
            lVar3 = *(long *)(lVar2 + 0x30);
            if (lVar3 != 0) {
              *(undefined8 *)(lVar3 + 0x28) = 0;
            }
            *(undefined8 *)(local_30 + 0x28) = 0;
            *(undefined8 *)(local_30 + 0x30) = 0;
            *(undefined8 *)(lVar2 + 0x28) = 0;
            *(undefined8 *)(lVar2 + 0x30) = 0;
            lVar5 = lVar2;
            if ((local_30 != 0) && (lVar5 = local_30, lVar2 != 0)) {
              iVar6 = extent_snad_comp(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
              if (iVar6 < 0) {
                *(long *)(lVar2 + 0x28) = local_30;
                lVar4 = *(long *)(local_30 + 0x38);
                *(long *)(lVar2 + 0x30) = lVar4;
                if (lVar4 != 0) {
                  *(long *)(lVar4 + 0x28) = lVar2;
                }
                *(long *)(local_30 + 0x38) = lVar2;
              }
              else {
                *(long *)(local_30 + 0x28) = lVar2;
                lVar5 = *(long *)(lVar2 + 0x38);
                *(long *)(local_30 + 0x30) = lVar5;
                if (lVar5 != 0) {
                  *(long *)(lVar5 + 0x28) = local_30;
                }
                *(long *)(lVar2 + 0x38) = local_30;
                lVar5 = lVar2;
              }
            }
            local_30 = lVar5;
            *(long *)(local_28 + 0x30) = local_30;
            local_28 = local_30;
            local_30 = lVar3;
          }
        }
        local_38 = *(long *)(lVar1 + 0x30);
        local_30 = lVar1;
        if (local_38 != 0) {
          while( true ) {
            lVar1 = *(long *)(local_38 + 0x30);
            *(undefined8 *)(local_30 + 0x30) = 0;
            *(undefined8 *)(local_38 + 0x30) = 0;
            if (local_30 == 0) {
              local_30 = local_38;
            }
            else if (local_38 != 0) {
              iVar6 = extent_snad_comp(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
              if (iVar6 < 0) {
                *(long *)(local_38 + 0x28) = local_30;
                lVar2 = *(long *)(local_30 + 0x38);
                *(long *)(local_38 + 0x30) = lVar2;
                if (lVar2 != 0) {
                  *(long *)(lVar2 + 0x28) = local_38;
                }
                *(long *)(local_30 + 0x38) = local_38;
              }
              else {
                *(long *)(local_30 + 0x28) = local_38;
                lVar2 = *(long *)(local_38 + 0x38);
                *(long *)(local_30 + 0x30) = lVar2;
                if (lVar2 != 0) {
                  *(long *)(lVar2 + 0x28) = local_30;
                }
                *(long *)(local_38 + 0x38) = local_30;
                local_30 = local_38;
              }
            }
            if (lVar1 == 0) break;
            *(long *)(local_28 + 0x30) = local_30;
            local_28 = local_30;
            local_38 = *(long *)(lVar1 + 0x30);
            local_30 = lVar1;
          }
        }
      }
      if (*in_RDI == 0) {
        *in_RDI = local_30;
      }
      else if (local_30 == 0) {
        *in_RDI = *in_RDI;
      }
      else {
        iVar6 = extent_snad_comp(in_stack_ffffffffffffff88,in_stack_ffffffffffffff80);
        if (iVar6 < 0) {
          *(long *)(local_30 + 0x28) = *in_RDI;
          lVar1 = *(long *)(*in_RDI + 0x38);
          *(long *)(local_30 + 0x30) = lVar1;
          if (lVar1 != 0) {
            *(long *)(lVar1 + 0x28) = local_30;
          }
          *(long *)(*in_RDI + 0x38) = local_30;
          *in_RDI = *in_RDI;
        }
        else {
          *(long *)(*in_RDI + 0x28) = local_30;
          lVar1 = *(long *)(local_30 + 0x38);
          *(long *)(*in_RDI + 0x30) = lVar1;
          if (lVar1 != 0) {
            *(long *)(lVar1 + 0x28) = *in_RDI;
          }
          *(long *)(local_30 + 0x38) = *in_RDI;
          *in_RDI = local_30;
        }
      }
    }
    local_8 = (extent_t *)*in_RDI;
  }
  return local_8;
}

Assistant:

bool
extents_init(tsdn_t *tsdn, extents_t *extents, extent_state_t state,
    bool delay_coalesce) {
	if (malloc_mutex_init(&extents->mtx, "extents", WITNESS_RANK_EXTENTS,
	    malloc_mutex_rank_exclusive)) {
		return true;
	}
	for (unsigned i = 0; i < SC_NPSIZES + 1; i++) {
		extent_heap_new(&extents->heaps[i]);
	}
	bitmap_init(extents->bitmap, &extents_bitmap_info, true);
	extent_list_init(&extents->lru);
	atomic_store_zu(&extents->npages, 0, ATOMIC_RELAXED);
	extents->state = state;
	extents->delay_coalesce = delay_coalesce;
	return false;
}